

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::LogToTTY(int auto_open_depth)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  if (GImGui->LogEnabled == false) {
    pIVar1 = GImGui->CurrentWindow;
    GImGui->LogEnabled = true;
    pIVar2->LogType = ImGuiLogType_TTY;
    pIVar2->LogNextPrefix = (char *)0x0;
    pIVar2->LogNextSuffix = (char *)0x0;
    pIVar2->LogDepthRef = (pIVar1->DC).TreeDepth;
    if (auto_open_depth < 0) {
      auto_open_depth = pIVar2->LogDepthToExpandDefault;
    }
    pIVar2->LogDepthToExpand = auto_open_depth;
    pIVar2->LogLinePosY = 3.4028235e+38;
    pIVar2->LogLineFirstItem = true;
    pIVar2->LogFile = _stdout;
  }
  return;
}

Assistant:

void ImGui::LogToTTY(int auto_open_depth)
{
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled)
        return;
    IM_UNUSED(auto_open_depth);
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
    LogBegin(ImGuiLogType_TTY, auto_open_depth);
    g.LogFile = stdout;
#endif
}